

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  string fileName;
  string newFileName;
  string result;
  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmCAString resultArg;
  ostringstream e;
  cmCAString newFileArg;
  cmCAString fileArg;
  cmCAString linkArg;
  cmCAEnabler symbolicArg;
  cmCAEnabler copyOnErrorArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  string local_4b8;
  cmCommandArgumentsHelper local_498;
  cmCommandArgumentGroup local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  cmCAString local_438;
  undefined1 local_3c0 [112];
  ios_base local_350 [264];
  cmCAString local_248;
  cmCAString local_1d0;
  cmCAString local_158;
  cmCAEnabler local_e0;
  cmCAEnabler local_88;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_3c0._0_8_ = local_3c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3c0,
               "CREATE_LINK must be called with at least two additional arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3c0);
    if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
      operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
    }
    return false;
  }
  local_498.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmCAString::cmCAString(&local_158,&local_498,"CREATE_LINK",(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_1d0,&local_498,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_248,&local_498,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_438,&local_498,"RESULT",&local_478);
  cmCAEnabler::cmCAEnabler(&local_88,&local_498,"COPY_ON_ERROR",&local_478);
  cmCAEnabler::cmCAEnabler(&local_e0,&local_498,"SYMBOLIC",&local_478);
  cmCommandArgument::Follows(&local_158.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgument::Follows(&local_1d0.super_cmCommandArgument,&local_158.super_cmCommandArgument);
  cmCommandArgument::Follows(&local_248.super_cmCommandArgument,&local_1d0.super_cmCommandArgument);
  cmCommandArgumentGroup::Follows(&local_478,&local_248.super_cmCommandArgument);
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&local_498,args,&local_458);
  if (local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&local_4f8,"unknown argument: \"",
                   local_458.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_4f8,local_4f8._M_string_length,0,'\x01');
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_3c0._16_8_ = *psVar6;
      local_3c0._24_8_ = plVar4[3];
      local_3c0._0_8_ = local_3c0 + 0x10;
    }
    else {
      local_3c0._16_8_ = *psVar6;
      local_3c0._0_8_ = (size_type *)*plVar4;
    }
    local_3c0._8_8_ = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3c0);
    if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
      operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
    goto LAB_00246fd8;
  }
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,local_1d0.String._M_dataplus._M_p,
             local_1d0.String._M_dataplus._M_p + local_1d0.String._M_string_length);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_248.String._M_dataplus._M_p,
             local_248.String._M_dataplus._M_p + local_248.String._M_string_length);
  paVar1 = &local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  local_4b8._M_dataplus._M_p = (pointer)paVar1;
  if ((local_4f8._M_string_length == local_4d8._M_string_length) &&
     ((local_4f8._M_string_length == 0 ||
      (iVar3 = bcmp(local_4f8._M_dataplus._M_p,local_4d8._M_dataplus._M_p,local_4f8._M_string_length
                   ), iVar3 == 0)))) {
    std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,0x4f0e5e);
LAB_00246f4f:
    if (local_438.String._M_string_length == 0) {
      cmCommand::SetError(&this->super_cmCommand,&local_4b8);
LAB_00246f91:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_438.String,local_4b8._M_dataplus._M_p);
    }
  }
  else {
    if ((local_e0.Enabled == false) && (bVar2 = cmsys::SystemTools::FileExists(&local_4f8), !bVar2))
    {
      std::operator+(&local_518,"Cannot hard link \'",&local_4f8);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_518);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        local_3c0._16_8_ = *psVar6;
        local_3c0._24_8_ = plVar4[3];
        local_3c0._0_8_ = local_3c0 + 0x10;
      }
      else {
        local_3c0._16_8_ = *psVar6;
        local_3c0._0_8_ = (size_type *)*plVar4;
      }
      local_3c0._8_8_ = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_4b8,(string *)local_3c0);
      if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
        operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00246f4f;
    }
    bVar2 = cmsys::SystemTools::FileExists(&local_4d8);
    if (((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(&local_4d8), !bVar2)) ||
       (bVar2 = cmsys::SystemTools::RemoveFile(&local_4d8), bVar2)) {
      if (local_e0.Enabled == true) {
        bVar2 = cmSystemTools::CreateSymlink(&local_4f8,&local_4d8,&local_4b8);
      }
      else {
        bVar2 = cmSystemTools::CreateLink(&local_4f8,&local_4d8,&local_4b8);
      }
      if ((bVar2 == false) && (local_88.Enabled == true)) {
        bVar2 = cmsys::SystemTools::CopyFileAlways(&local_4f8,&local_4d8);
        if (!bVar2) {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c0,"Copy failed: ",&local_518);
          std::__cxx11::string::operator=((string *)&local_4b8,(string *)local_3c0);
          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
            operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (bVar2 != false) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_4b8,0,(char *)local_4b8._M_string_length,0x53c3de);
LAB_00246e65:
        bVar2 = true;
        if (local_438.String._M_string_length != 0) {
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&local_438.String,local_4b8._M_dataplus._M_p);
        }
        goto LAB_00246f93;
      }
      if (local_438.String._M_string_length != 0) goto LAB_00246e65;
      cmCommand::SetError(&this->super_cmCommand,&local_4b8);
      goto LAB_00246f91;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3c0,"Failed to create link \'",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3c0,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\' because existing path cannot be removed: ",0x2b);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_518._M_dataplus._M_p,local_518._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    bVar2 = local_438.String._M_string_length != 0;
    if (local_438.String._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_518);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(this_00,&local_438.String,local_518._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c0);
    std::ios_base::~ios_base(local_350);
  }
LAB_00246f93:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b8._M_dataplus._M_p,
                    CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                             local_4b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
LAB_00246fd8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  local_e0.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_e0.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_88.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_88.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_438.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_00632c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.String._M_dataplus._M_p != &local_438.String.field_2) {
    operator_delete(local_438.String._M_dataplus._M_p,
                    local_438.String.field_2._M_allocated_capacity + 1);
  }
  local_438.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_438.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_248.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_00632c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.String._M_dataplus._M_p != &local_248.String.field_2) {
    operator_delete(local_248.String._M_dataplus._M_p,
                    local_248.String.field_2._M_allocated_capacity + 1);
  }
  local_248.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_248.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_1d0.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_00632c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.String._M_dataplus._M_p != &local_1d0.String.field_2) {
    operator_delete(local_1d0.String._M_dataplus._M_p,
                    local_1d0.String.field_2._M_allocated_capacity + 1);
  }
  local_1d0.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_1d0.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_158.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_00632c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.String._M_dataplus._M_p != &local_158.String.field_2) {
    operator_delete(local_158.String._M_dataplus._M_p,
                    local_158.String.field_2._M_allocated_capacity + 1);
  }
  local_158.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0062d688;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_158.super_cmCommandArgument.ArgumentsBefore._M_t);
  if (local_478.ContainedArguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.ContainedArguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.Arguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.Arguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString linkArg(&argHelper, "CREATE_LINK");
  cmCAString fileArg(&argHelper, nullptr);
  cmCAString newFileArg(&argHelper, nullptr);

  cmCAString resultArg(&argHelper, "RESULT", &group);
  cmCAEnabler copyOnErrorArg(&argHelper, "COPY_ON_ERROR", &group);
  cmCAEnabler symbolicArg(&argHelper, "SYMBOLIC", &group);

  linkArg.Follows(nullptr);
  fileArg.Follows(&linkArg);
  newFileArg.Follows(&fileArg);
  group.Follows(&newFileArg);

  std::vector<std::string> unconsumedArgs;
  argHelper.Parse(&args, &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  std::string fileName = fileArg.GetString();
  std::string newFileName = newFileArg.GetString();

  // Output variable for storing the result.
  const std::string& resultVar = resultArg.GetString();

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!symbolicArg.IsEnabled() && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (symbolicArg.IsEnabled()) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && copyOnErrorArg.IsEnabled()) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (resultVar.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!resultVar.empty()) {
    this->Makefile->AddDefinition(resultVar, result.c_str());
  }

  return true;
}